

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

void __thiscall QtFontStyle::~QtFontStyle(QtFontStyle *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  while (3 < *(uint *)&this->field_0x4) {
    *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 - 4;
    if (QGuiApplicationPrivate::platform_integration != (QPlatformIntegration *)0x0) {
      iVar1 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                ((long *)CONCAT44(extraout_var,iVar1),
                 this->pixelSizes[*(int *)&this->field_0x4 >> 2].handle);
    }
  }
  free(this->pixelSizes);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->styleName).d);
  return;
}

Assistant:

QtFontStyle::~QtFontStyle()
{
   while (count) {
       // bitfield count-- in while condition does not work correctly in mwccsym2
       count--;
       QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
       if (integration)
           integration->fontDatabase()->releaseHandle(pixelSizes[count].handle);
   }

   free(pixelSizes);
}